

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

Resource res_getTableItemByIndex_63(ResourceData *pResData,Resource table,int32_t indexR,char **key)

{
  ushort uVar1;
  ushort uVar2;
  int32_t *piVar3;
  uint16_t *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  int32_t *piVar9;
  uint uVar10;
  
  if (indexR < 0) {
    return 0xffffffff;
  }
  uVar6 = table & 0xfffffff;
  uVar7 = table >> 0x1c;
  if (uVar7 == 5) {
    puVar4 = pResData->p16BitUnits;
    uVar7 = (uint)puVar4[uVar6];
    if (indexR < (int)uVar7) {
      if (key != (char **)0x0) {
        uVar1 = puVar4[(ulong)uVar6 + (ulong)(uint)indexR + 1];
        if ((int)(uint)uVar1 < pResData->localKeyLimit) {
          pcVar8 = (char *)((ulong)uVar1 + (long)pResData->pRoot);
        }
        else {
          pcVar8 = pResData->poolBundleKeys + ((ulong)uVar1 - (long)pResData->localKeyLimit);
        }
        *key = pcVar8;
      }
      uVar1 = puVar4[(ulong)uVar6 + (ulong)(uVar7 + indexR) + 1];
      uVar6 = (uint)uVar1;
      if (pResData->poolStringIndex16Limit <= (int)(uint)uVar1) {
        uVar6 = ((uint)uVar1 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
      }
      uVar6 = uVar6 | 0x60000000;
    }
  }
  else if (uVar7 == 4) {
    if (uVar6 == 0) {
      return 0xffffffff;
    }
    piVar3 = pResData->pRoot;
    uVar7 = piVar3[uVar6];
    if (indexR < (int)uVar7) {
      if (key != (char **)0x0) {
        uVar10 = piVar3[(ulong)uVar6 + (ulong)(uint)indexR + 1];
        piVar9 = piVar3;
        if ((int)uVar10 < 0) {
          piVar9 = (int32_t *)pResData->poolBundleKeys;
          uVar10 = uVar10 & 0x7fffffff;
        }
        *key = (char *)((ulong)uVar10 + (long)piVar9);
      }
      uVar6 = piVar3[(ulong)uVar6 + (ulong)(uVar7 + indexR) + 1];
    }
  }
  else {
    if (uVar7 != 2) {
      return 0xffffffff;
    }
    if (uVar6 == 0) {
      return 0xffffffff;
    }
    piVar3 = pResData->pRoot;
    uVar1 = *(ushort *)(piVar3 + uVar6);
    uVar7 = (uint)uVar1;
    if (indexR < (int)(uint)uVar1) {
      lVar5 = (ulong)uVar6 * 4 + 2;
      if (key != (char **)0x0) {
        uVar2 = *(ushort *)((long)piVar3 + (ulong)(uint)indexR * 2 + lVar5);
        if ((int)(uint)uVar2 < pResData->localKeyLimit) {
          pcVar8 = (char *)((long)piVar3 + (ulong)uVar2);
        }
        else {
          pcVar8 = pResData->poolBundleKeys + ((ulong)uVar2 - (long)pResData->localKeyLimit);
        }
        *key = pcVar8;
      }
      uVar6 = *(uint *)((long)piVar3 +
                       (ulong)(uint)indexR * 4 +
                       (ulong)(~(uint)uVar1 & 1) * 2 + (ulong)(uint)uVar1 * 2 + lVar5);
    }
  }
  if ((int)uVar7 <= indexR) {
    return 0xffffffff;
  }
  return uVar6;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByIndex(const ResourceData *pResData, Resource table,
                        int32_t indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    if (indexR < 0) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset != 0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            if(indexR<length) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                if(key!=NULL) {
                    *key=RES_GET_KEY16(pResData, p[indexR]);
                }
                return p32[indexR];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        if(indexR<length) {
            if(key!=NULL) {
                *key=RES_GET_KEY16(pResData, p[indexR]);
            }
            return makeResourceFrom16(pResData, p[length+indexR]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset != 0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            if(indexR<length) {
                if(key!=NULL) {
                    *key=RES_GET_KEY32(pResData, p[indexR]);
                }
                return (Resource)p[length+indexR];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}